

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

SizeAlignment __thiscall
dxil_spv::Converter::Impl::get_physical_size_for_type(Impl *this,Id type_id)

{
  bool bVar1;
  Id IVar2;
  int iVar3;
  Builder *pBVar4;
  uint *puVar5;
  SizeAlignment local_44;
  SizeAlignment member_res;
  uint32_t member_type_id;
  int i;
  int num_members;
  uint32_t array_size;
  Id type_id_local;
  Impl *this_local;
  SizeAlignment res;
  
  memset(&this_local,0,8);
  pBVar4 = builder(this);
  bVar1 = spv::Builder::isScalarType(pBVar4,type_id);
  if (bVar1) {
    pBVar4 = builder(this);
    iVar3 = spv::Builder::getScalarTypeWidth(pBVar4,type_id);
    this_local = (Impl *)CONCAT44(iVar3 / 8,iVar3 / 8);
  }
  else {
    pBVar4 = builder(this);
    bVar1 = spv::Builder::isVectorType(pBVar4,type_id);
    if (bVar1) {
      pBVar4 = builder(this);
      IVar2 = spv::Builder::getContainedTypeId(pBVar4,type_id);
      this_local = (Impl *)get_physical_size_for_type(this,IVar2);
      pBVar4 = builder(this);
      iVar3 = spv::Builder::getNumComponents(pBVar4,type_id);
      this_local = (Impl *)CONCAT44(this_local._4_4_,iVar3 * (int)this_local);
    }
    else {
      pBVar4 = builder(this);
      bVar1 = spv::Builder::isArrayType(pBVar4,type_id);
      if (bVar1) {
        pBVar4 = builder(this);
        IVar2 = spv::Builder::getContainedTypeId(pBVar4,type_id);
        this_local = (Impl *)get_physical_size_for_type(this,IVar2);
        pBVar4 = builder(this);
        iVar3 = spv::Builder::getNumTypeConstituents(pBVar4,type_id);
        this_local = (Impl *)CONCAT44(this_local._4_4_,iVar3 * (int)this_local);
      }
      else {
        pBVar4 = builder(this);
        bVar1 = spv::Builder::isStructType(pBVar4,type_id);
        if (bVar1) {
          pBVar4 = builder(this);
          iVar3 = spv::Builder::getNumTypeConstituents(pBVar4,type_id);
          for (member_res.alignment = 0; (int)member_res.alignment < iVar3;
              member_res.alignment = member_res.alignment + 1) {
            pBVar4 = builder(this);
            member_res.size = spv::Builder::getContainedTypeId(pBVar4,type_id,member_res.alignment);
            local_44 = get_physical_size_for_type(this,member_res.size);
            this_local = (Impl *)CONCAT44(this_local._4_4_,
                                          local_44.size +
                                          (((int)this_local + local_44.alignment) - 1 &
                                          (local_44.alignment - 1 ^ 0xffffffff)));
            puVar5 = std::max<unsigned_int>((uint *)((long)&this_local + 4),&local_44.alignment);
            this_local = (Impl *)CONCAT44(*puVar5,(int)this_local);
          }
          this_local = (Impl *)CONCAT44(this_local._4_4_,
                                        ((int)this_local + this_local._4_4_) - 1U &
                                        (this_local._4_4_ - 1U ^ 0xffffffff));
        }
        else {
          pBVar4 = builder(this);
          bVar1 = spv::Builder::isPointerType(pBVar4,type_id);
          if (bVar1) {
            this_local = (Impl *)0x800000008;
          }
        }
      }
    }
  }
  return (SizeAlignment)this_local;
}

Assistant:

Converter::Impl::SizeAlignment Converter::Impl::get_physical_size_for_type(spv::Id type_id)
{
	SizeAlignment res = {};

	if (builder().isScalarType(type_id))
	{
		res.size = builder().getScalarTypeWidth(type_id) / 8;
		res.alignment = res.size;
	}
	else if (builder().isVectorType(type_id))
	{
		res = get_physical_size_for_type(builder().getContainedTypeId(type_id));
		res.size *= builder().getNumComponents(type_id);
	}
	else if (builder().isArrayType(type_id))
	{
		res = get_physical_size_for_type(builder().getContainedTypeId(type_id));
		uint32_t array_size = builder().getNumTypeConstituents(type_id);
		// Alignment is inherited from constituent, we do scalar block layout here.
		res.size *= array_size;
	}
	else if (builder().isStructType(type_id))
	{
		int num_members = builder().getNumTypeConstituents(type_id);
		for (int i = 0; i < num_members; i++)
		{
			uint32_t member_type_id = builder().getContainedTypeId(type_id, i);
			auto member_res = get_physical_size_for_type(member_type_id);
			res.size = (res.size + member_res.alignment - 1) & ~(member_res.alignment - 1);
			res.size += member_res.size;
			res.alignment = std::max<uint32_t>(res.alignment, member_res.alignment);
		}
		res.size = (res.size + res.alignment - 1) & ~(res.alignment - 1);
	}
	else if (builder().isPointerType(type_id))
	{
		res.size = sizeof(uint64_t);
		res.alignment = sizeof(uint64_t);
	}

	return res;
}